

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunScriptCommand.h
# Opt level: O3

cmCommand * __thiscall cmCTestRunScriptCommand::Clone(cmCTestRunScriptCommand *this)

{
  cmMakefile *pcVar1;
  cmCommand *pcVar2;
  
  pcVar2 = (cmCommand *)operator_new(0x60);
  (pcVar2->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pcVar2->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pcVar2->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->Makefile = (cmMakefile *)0x0;
  pcVar2->Enabled = true;
  (pcVar2->super_cmObject)._vptr_cmObject = (_func_int **)&PTR__cmCommand_006b78c8;
  pcVar1 = (cmMakefile *)(this->super_cmCTestCommand).CTestScriptHandler;
  pcVar2[1].super_cmObject._vptr_cmObject = (_func_int **)(this->super_cmCTestCommand).CTest;
  pcVar2[1].Makefile = pcVar1;
  return pcVar2;
}

Assistant:

virtual cmCommand* Clone()
    {
    cmCTestRunScriptCommand* ni = new cmCTestRunScriptCommand;
    ni->CTest = this->CTest;
    ni->CTestScriptHandler = this->CTestScriptHandler;
    return ni;
    }